

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O0

int amqp_ssl_socket_set_cert(amqp_socket_t *base,char *cert)

{
  int iVar1;
  char *in_RSI;
  long *in_RDI;
  amqp_ssl_socket_t *self;
  int status;
  int local_4;
  
  if ((amqp_socket_class_t *)*in_RDI != &amqp_ssl_socket_class) {
    amqp_abort("<%p> is not of type amqp_ssl_socket_t",in_RDI);
  }
  iVar1 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)in_RDI[1],in_RSI);
  if (iVar1 == 1) {
    local_4 = 0;
  }
  else {
    local_4 = -0x200;
  }
  return local_4;
}

Assistant:

int amqp_ssl_socket_set_cert(amqp_socket_t *base, const char *cert) {
  int status;
  struct amqp_ssl_socket_t *self;
  if (base->klass != &amqp_ssl_socket_class) {
    amqp_abort("<%p> is not of type amqp_ssl_socket_t", base);
  }
  self = (struct amqp_ssl_socket_t *)base;
  status = SSL_CTX_use_certificate_chain_file(self->ctx, cert);
  if (1 != status) {
    return AMQP_STATUS_SSL_ERROR;
  }
  return AMQP_STATUS_OK;
}